

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

void __thiscall
kj::_::Debug::Fault::
Fault<kj::Exception::Type,char_const(&)[10],kj::StringPtr_const&,unsigned_long_const&,char_const(&)[21]>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,
          char (*params) [10],StringPtr *params_1,unsigned_long *params_2,char (*params_3) [21])

{
  undefined4 in_register_00000014;
  StringPtr *params_00;
  unsigned_long *params_01;
  char (*params_02) [21];
  long lVar1;
  String argValues [4];
  
  this->exception = (Exception *)0x0;
  str<char_const(&)[10]>(argValues,(kj *)params,(char (*) [10])CONCAT44(in_register_00000014,line));
  str<kj::StringPtr_const&>(argValues + 1,(kj *)params_1,params_00);
  str<unsigned_long_const&>(argValues + 2,(kj *)params_2,params_01);
  str<char_const(&)[21]>(argValues + 3,(kj *)params_3,params_02);
  init(this,(EVP_PKEY_CTX *)file);
  lVar1 = 0x48;
  do {
    Array<char>::~Array((Array<char> *)((long)&argValues[0].content.ptr + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}